

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::Incomplete2DMissingLevelCase::createTexture
          (Incomplete2DMissingLevelCase *this)

{
  uint uVar1;
  GLenum err;
  uint uVar2;
  uint uVar3;
  int level;
  GLsizei height;
  GLsizei width;
  GLuint texture;
  TextureFormat fmt;
  undefined1 local_90 [16];
  TextureLevel levelData;
  PixelBufferAccess local_58;
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  uVar3 = (this->m_size).m_data[0];
  uVar1 = 0x20;
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  uVar3 = (this->m_size).m_data[1];
  if (uVar3 != 0) {
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x1f;
  }
  uVar3 = 0x1f - uVar1;
  if ((int)(0x1f - uVar1) < (int)(0x1f - uVar2)) {
    uVar3 = 0x1f - uVar2;
  }
  if (uVar3 < 0x7fffffff) {
    level = 0;
    do {
      tcu::TextureLevel::setSize(&levelData,(this->m_size).m_data[0],(this->m_size).m_data[1],1);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      local_90._0_4_ = 0.0;
      local_90._4_4_ = 0.0;
      local_90._8_8_ = &DAT_3f8000003f800000;
      tcu::clear(&local_58,(Vec4 *)local_90);
      width = (this->m_size).m_data[0] >> ((byte)level & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->m_size).m_data[1] >> ((byte)level & 0x1f);
      if (height < 2) {
        height = 1;
      }
      if (level != *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
        tcu::TextureLevel::getAccess(&local_58,&levelData);
        glwTexImage2D(0xde1,level,0x1908,width,height,0,0x1908,0x1401,
                      local_58.super_ConstPixelBufferAccess.m_data);
      }
      level = level + 1;
    } while (uVar3 + 1 != level);
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x1a3);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void Incomplete2DMissingLevelCase::createTexture (void)
{
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		// Skip specified level.
		if (levelNdx != m_missingLevelNdx)
			glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");
}